

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

bool __thiscall Highs::qFormatOk(Highs *this,HighsInt num_nz,HighsInt format)

{
  uint in_EDX;
  int in_ESI;
  long in_RDI;
  bool ok_format;
  bool local_1;
  
  if (in_ESI == 0) {
    local_1 = true;
  }
  else {
    local_1 = in_EDX == 1;
    if (!local_1) {
      highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                   "Non-empty Hessian matrix has illegal format = %d\n",(ulong)in_EDX);
    }
  }
  return local_1;
}

Assistant:

bool Highs::qFormatOk(const HighsInt num_nz, const HighsInt format) {
  if (!num_nz) return true;
  const bool ok_format = format == (HighsInt)HessianFormat::kTriangular;
  assert(ok_format);
  if (!ok_format)
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "Non-empty Hessian matrix has illegal format = %" HIGHSINT_FORMAT "\n",
        format);
  return ok_format;
}